

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_tess_level.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_60dd4::lower_tess_level_visitor::visit
          (lower_tess_level_visitor *this,ir_variable *ir)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  exec_node *local_50;
  exec_node *local_30;
  ir_variable *ir_local;
  lower_tess_level_visitor *this_local;
  
  if ((ir->name != (char *)0x0) &&
     ((iVar2 = strcmp(ir->name,"gl_TessLevelInner"), iVar2 == 0 ||
      (iVar2 = strcmp(ir->name,"gl_TessLevelOuter"), iVar2 == 0)))) {
    bVar1 = glsl_type::is_array(ir->type);
    if (!bVar1) {
      __assert_fail("ir->type->is_array()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x6e,
                    "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                   );
    }
    iVar2 = strcmp(ir->name,"gl_TessLevelOuter");
    if (iVar2 == 0) {
      if (this->old_tess_level_outer_var != (ir_variable *)0x0) {
        return visit_continue;
      }
      this->old_tess_level_outer_var = ir;
      if ((ir->type->fields).array != &glsl_type::_float_type) {
        __assert_fail("ir->type->fields.array == glsl_type::float_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x75,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      pvVar3 = ralloc_parent(ir);
      iVar2 = (*(ir->super_ir_instruction)._vptr_ir_instruction[4])(ir,pvVar3,0);
      this->new_tess_level_outer_var = (ir_variable *)CONCAT44(extraout_var,iVar2);
      pcVar4 = ralloc_strdup(this->new_tess_level_outer_var,"gl_TessLevelOuterMESA");
      this->new_tess_level_outer_var->name = pcVar4;
      this->new_tess_level_outer_var->type = &glsl_type::_vec4_type;
      (this->new_tess_level_outer_var->data).max_array_access = 0;
      local_30 = (exec_node *)0x0;
      if (this->new_tess_level_outer_var != (ir_variable *)0x0) {
        local_30 = &(this->new_tess_level_outer_var->super_ir_instruction).super_exec_node;
      }
      exec_node::replace_with(&(ir->super_ir_instruction).super_exec_node,local_30);
    }
    else {
      iVar2 = strcmp(ir->name,"gl_TessLevelInner");
      if (iVar2 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x93,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      if (this->old_tess_level_inner_var != (ir_variable *)0x0) {
        return visit_continue;
      }
      this->old_tess_level_inner_var = ir;
      if ((ir->type->fields).array != &glsl_type::_float_type) {
        __assert_fail("ir->type->fields.array == glsl_type::float_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x86,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      pvVar3 = ralloc_parent(ir);
      iVar2 = (*(ir->super_ir_instruction)._vptr_ir_instruction[4])(ir,pvVar3,0);
      this->new_tess_level_inner_var = (ir_variable *)CONCAT44(extraout_var_00,iVar2);
      pcVar4 = ralloc_strdup(this->new_tess_level_inner_var,"gl_TessLevelInnerMESA");
      this->new_tess_level_inner_var->name = pcVar4;
      this->new_tess_level_inner_var->type = &glsl_type::_vec2_type;
      (this->new_tess_level_inner_var->data).max_array_access = 0;
      local_50 = (exec_node *)0x0;
      if (this->new_tess_level_inner_var != (ir_variable *)0x0) {
        local_50 = &(this->new_tess_level_inner_var->super_ir_instruction).super_exec_node;
      }
      exec_node::replace_with(&(ir->super_ir_instruction).super_exec_node,local_50);
    }
    (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    field_0x31 = 1;
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
lower_tess_level_visitor::visit(ir_variable *ir)
{
   if ((!ir->name) ||
       ((strcmp(ir->name, "gl_TessLevelInner") != 0) &&
        (strcmp(ir->name, "gl_TessLevelOuter") != 0)))
      return visit_continue;

   assert (ir->type->is_array());

   if (strcmp(ir->name, "gl_TessLevelOuter") == 0) {
      if (this->old_tess_level_outer_var)
         return visit_continue;

      old_tess_level_outer_var = ir;
      assert(ir->type->fields.array == glsl_type::float_type);

      /* Clone the old var so that we inherit all of its properties */
      new_tess_level_outer_var = ir->clone(ralloc_parent(ir), NULL);

      /* And change the properties that we need to change */
      new_tess_level_outer_var->name = ralloc_strdup(new_tess_level_outer_var,
                                                "gl_TessLevelOuterMESA");
      new_tess_level_outer_var->type = glsl_type::vec4_type;
      new_tess_level_outer_var->data.max_array_access = 0;

      ir->replace_with(new_tess_level_outer_var);
   } else if (strcmp(ir->name, "gl_TessLevelInner") == 0) {
      if (this->old_tess_level_inner_var)
         return visit_continue;

      old_tess_level_inner_var = ir;
      assert(ir->type->fields.array == glsl_type::float_type);

      /* Clone the old var so that we inherit all of its properties */
      new_tess_level_inner_var = ir->clone(ralloc_parent(ir), NULL);

      /* And change the properties that we need to change */
      new_tess_level_inner_var->name = ralloc_strdup(new_tess_level_inner_var,
                                                "gl_TessLevelInnerMESA");
      new_tess_level_inner_var->type = glsl_type::vec2_type;
      new_tess_level_inner_var->data.max_array_access = 0;

      ir->replace_with(new_tess_level_inner_var);
   } else {
      assert(0);
   }

   this->progress = true;

   return visit_continue;
}